

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O0

void __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::remove_any(map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             *this,domain *d,range *r)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  ostream *poVar4;
  string *a;
  undefined8 uVar5;
  void *in_RDX;
  void *in_RSI;
  long *in_RDI;
  ostringstream dlib_o_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_fffffffffffffd80;
  error_type t;
  ostream local_190;
  void *local_18;
  void *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  lVar1 = (**(code **)(*in_RDI + 0x40))();
  if ((lVar1 != 0) && (local_10 != local_18)) {
    map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::remove_any(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                 (unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>
                  *)0x3e295d);
    return;
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar2 = std::operator<<(&local_190,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8e);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<(&local_190,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/logger/../threads/../map/map_kernel_c.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<(&local_190,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "virtual void dlib::map_kernel_c<dlib::map_kernel_1<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::binary_search_tree_kernel_2<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::memory_manager_stateless_kernel_1<char>>>>::remove_any(domain &, range &) [map_base = dlib::map_kernel_1<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::binary_search_tree_kernel_2<std::basic_string<char>, std::unique_ptr<dlib::logger::global_data::output_streambuf_container>, dlib::memory_manager_stateless_kernel_1<char>>>]"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<(&local_190,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,
                           "(this->size() > 0) && (static_cast<void*>(&d) != static_cast<void*>(&r))"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = (ostream *)std::ostream::operator<<(&local_190,std::boolalpha);
  poVar2 = std::operator<<(poVar2,"\tvoid map::remove_any");
  poVar2 = std::operator<<(poVar2,
                           "\n\tsize() must be greater than zero if something is going to be removed"
                          );
  poVar2 = std::operator<<(poVar2,"\n\tand d and r must not be the same variable.");
  poVar2 = std::operator<<(poVar2,"\n\tsize(): ");
  uVar3 = (**(code **)(*in_RDI + 0x40))();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
  poVar2 = std::operator<<(poVar2,"\n\tthis:   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI);
  poVar4 = std::operator<<(poVar2,"\n\t&d:     ");
  a = (string *)std::ostream::operator<<(poVar4,local_10);
  t = (error_type)((ulong)poVar4 >> 0x20);
  poVar4 = std::operator<<((ostream *)a,"\n\t&r:     ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
  std::operator<<(poVar4,"\n");
  uVar5 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar2,t,a);
  __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void map_kernel_c<map_base>::
    remove_any (
        domain& d,
        range& r
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (this->size() > 0)  &&
                (static_cast<void*>(&d) != static_cast<void*>(&r)),
            "\tvoid map::remove_any"
            << "\n\tsize() must be greater than zero if something is going to be removed"
            << "\n\tand d and r must not be the same variable."
            << "\n\tsize(): " << this->size() 
            << "\n\tthis:   " << this
            << "\n\t&d:     " << static_cast<void*>(&d)
            << "\n\t&r:     " << static_cast<void*>(&r)
            );

        // call the real function
        map_base::remove_any(d,r);
    }